

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.cpp
# Opt level: O3

bool wasm::Name::isIDChar(char c)

{
  undefined **ppuVar1;
  bool bVar2;
  undefined1 local_11 [8];
  char c_local;
  
  bVar2 = true;
  if ((9 < (byte)(c - 0x30U)) && (0x19 < (byte)((c & 0xdfU) + 0xbf))) {
    ppuVar1 = (undefined **)
              std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (&isIDChar::otherIDChars,&PTR_typeinfo_010b0920,local_11);
    bVar2 = ppuVar1 != &PTR_typeinfo_010b0920;
  }
  return bVar2;
}

Assistant:

bool Name::isIDChar(char c) {
  if ('0' <= c && c <= '9') {
    return true;
  }
  if ('A' <= c && c <= 'Z') {
    return true;
  }
  if ('a' <= c && c <= 'z') {
    return true;
  }
  static std::array<char, 23> otherIDChars = {
    {'!', '#', '$', '%', '&', '\'', '*', '+', '-', '.', '/', ':',
     '<', '=', '>', '?', '@', '\\', '^', '_', '`', '|', '~'}};
  return std::find(otherIDChars.begin(), otherIDChars.end(), c) !=
         otherIDChars.end();
}